

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewSequentialFile
          (PosixEnv *this,string *filename,SequentialFile **result)

{
  int iVar1;
  undefined8 *puVar2;
  int *piVar3;
  undefined8 *in_RCX;
  long in_FS_OFFSET;
  long *local_58;
  long local_50;
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = open((char *)*result,0x80000);
  if (iVar1 < 0) {
    *in_RCX = 0;
    piVar3 = __errno_location();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      PosixError((anon_unknown_1 *)this,(string *)result,*piVar3);
      return (Status)(char *)this;
    }
  }
  else {
    puVar2 = (undefined8 *)operator_new(0x30);
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,*result,
               (long)&(*result)->_vptr_SequentialFile + (long)&result[1]->_vptr_SequentialFile);
    *puVar2 = &PTR__PosixSequentialFile_013e2ea0;
    *(int *)(puVar2 + 1) = iVar1;
    puVar2[2] = puVar2 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar2 + 2),local_58,local_50 + (long)local_58);
    *in_RCX = puVar2;
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    (this->super_Env)._vptr_Env = (_func_int **)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (Status)(char *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

Status NewSequentialFile(const std::string& filename,
                           SequentialFile** result) override {
    int fd = ::open(filename.c_str(), O_RDONLY | kOpenBaseFlags);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    *result = new PosixSequentialFile(filename, fd);
    return Status::OK();
  }